

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratSmall.cpp
# Opt level: O3

void __thiscall
primesieve::EratSmall::storeSievingPrime
          (EratSmall *this,uint64_t prime,uint64_t multipleIndex,uint64_t wheelIndex)

{
  SievingPrime *pSVar1;
  long lVar2;
  
  pSVar1 = (this->primes_).end_;
  if (pSVar1 == (this->primes_).capacity_) {
    lVar2 = (long)pSVar1 - (long)(this->primes_).array_ >> 2;
    Vector<primesieve::SievingPrime,_std::allocator<primesieve::SievingPrime>_>::reserve_unchecked
              (&this->primes_,lVar2 + (ulong)(lVar2 == 0));
    pSVar1 = (this->primes_).end_;
  }
  pSVar1->indexes_ = (uint)multipleIndex | (int)wheelIndex << 0x17;
  pSVar1->sievingPrime_ = (uint32_t)(prime / 0x1e);
  (this->primes_).end_ = pSVar1 + 1;
  return;
}

Assistant:

void EratSmall::storeSievingPrime(uint64_t prime,
                                  uint64_t multipleIndex,
                                  uint64_t wheelIndex)
{
  ASSERT(prime <= maxPrime_);
  uint64_t sievingPrime = prime / 30;
  primes_.emplace_back(sievingPrime, multipleIndex, wheelIndex);
}